

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-sha512.c
# Opt level: O1

void ed25519_key_setup(uint8_t *out,uint8_t *sk)

{
  sha512 hash;
  sha512 sStack_e8;
  
  sha512_init(&sStack_e8);
  sha512_add(&sStack_e8,sk,0x20);
  sha512_final(&sStack_e8,out);
  out[0x1f] = out[0x1f] & 0x3f | 0x40;
  *out = *out & 0xf8;
  return;
}

Assistant:

static void
ed25519_key_setup(uint8_t out[SHA512_HASH_LENGTH],
		  const uint8_t sk[ED25519_KEY_LEN])
{
	struct sha512 hash;

	/* hash secret-key */
	sha512_init(&hash);
	sha512_add(&hash, sk, ED25519_KEY_LEN);
	sha512_final(&hash, out);

	/* delete bit 255 and set bit 254 */
	out[31] &= 0x7f;
	out[31] |= 0x40;
	/* delete 3 lowest bits */
	out[0] &= 0xf8;
}